

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

char * unshield_get_base_directory_name(Unshield *unshield)

{
  size_t __size;
  char *pcVar1;
  char *__dest;
  char *dirname;
  char *p;
  long path_max;
  Unshield *unshield_local;
  
  __size = unshield_get_path_max(unshield);
  pcVar1 = unshield_get_last_path_separator(unshield->filename_pattern);
  __dest = (char *)malloc(__size);
  if (pcVar1 == (char *)0x0) {
    strcpy(__dest,".");
  }
  else {
    strncpy(__dest,unshield->filename_pattern,__size);
    if ((long)__size < (long)(ulong)(uint)((int)pcVar1 - (int)unshield->filename_pattern)) {
      __dest[__size - 1] = '\0';
    }
    else {
      __dest[(long)pcVar1 - (long)unshield->filename_pattern] = '\0';
    }
  }
  return __dest;
}

Assistant:

char *unshield_get_base_directory_name(Unshield *unshield) {
    long int path_max = unshield_get_path_max(unshield);
    char *p = unshield_get_last_path_separator(unshield->filename_pattern);
    char *dirname = malloc(path_max);

    if (p) {
        strncpy(dirname, unshield->filename_pattern, path_max);
        if ((unsigned int) (p - unshield->filename_pattern) > path_max) {
            dirname[path_max - 1] = 0;
        } else
            dirname[(p - unshield->filename_pattern)] = 0;
    } else
        strcpy(dirname, ".");

    return dirname;
}